

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  TPZStructMatrixOR<double> *in_RDI;
  pointer_____offset_0x68___ *vtt;
  
  vtt = &TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,TPZStructMatrixOR<double>>,TPZVerySparseMatrix<double>,double,TPZStructMatrixOR<double>>
         ::VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_025a8670);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)&in_RDI[7].field_0x8,vtt + 0xd);
  *(_func_int ***)(in_RDI + 6) = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[6].field_0x8 = 0;
  *(undefined8 *)&in_RDI[5].field_0x8 = 0;
  *(undefined8 *)&in_RDI[5].field_0x10 = 0;
  *(undefined8 *)&in_RDI[4].field_0x10 = 0;
  *(_func_int ***)(in_RDI + 5) = (_func_int **)0x0;
  *(_func_int ***)(in_RDI + 4) = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[4].field_0x8 = 0;
  *(undefined8 *)&in_RDI[3].field_0x8 = 0;
  *(undefined8 *)&in_RDI[3].field_0x10 = 0;
  *(undefined8 *)&in_RDI[2].field_0x10 = 0;
  *(_func_int ***)(in_RDI + 3) = (_func_int **)0x0;
  *(_func_int ***)(in_RDI + 2) = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[2].field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0;
  *(undefined8 *)&in_RDI->field_0x10 = 0;
  *(_func_int ***)(in_RDI + 1) = (_func_int **)0x0;
  *(_func_int ***)in_RDI = (_func_int **)0x0;
  *(undefined8 *)&in_RDI->field_0x8 = 0;
  TPZStructMatrixT<double>::TPZStructMatrixT((TPZStructMatrixT<double> *)0x0,(void **)0x0);
  TPZStructMatrixOR<double>::TPZStructMatrixOR(in_RDI,vtt);
  *(undefined8 *)in_RDI = 0x25a83c8;
  *(undefined8 *)&in_RDI[7].field_0x8 = 0x25a8588;
  *(undefined8 *)in_RDI = 0x25a83c8;
  *(undefined8 *)&in_RDI[6].field_0x10 = 0x25a8488;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}